

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O3

VkDescriptorSet * __thiscall
vkt::pipeline::multisample::MSInstanceSampleMaskPattern::createMSPassDescSet
          (MSInstanceSampleMaskPattern *this,ImageMSParams *imageMSParams,
          VkDescriptorSetLayout *descSetLayout)

{
  Move<vk::Handle<(vk::HandleType)22>_> *pMVar1;
  VkDescriptorPool obj;
  deUint64 dVar2;
  DeviceInterface *pDVar3;
  Allocation *pAVar4;
  undefined8 uVar5;
  void *pvVar6;
  undefined8 uVar7;
  VkDeviceSize VVar8;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DescriptorPoolBuilder *this_00;
  Buffer *this_01;
  DescriptorSetUpdateBuilder *this_02;
  VkDescriptorBufferInfo descBufferInfo;
  DescriptorSetUpdateBuilder local_c8;
  VkBufferCreateInfo bufferSampleMaskInfo;
  
  vk = Context::getDeviceInterface
                 ((this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase
                  .super_TestInstance.m_context);
  device = Context::getDevice((this->super_MSInstanceBaseResolveAndPerSampleFetch).
                              super_MultisampleInstanceBase.super_TestInstance.m_context);
  allocator = Context::getDefaultAllocator
                        ((this->super_MSInstanceBaseResolveAndPerSampleFetch).
                         super_MultisampleInstanceBase.super_TestInstance.m_context);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&descBufferInfo);
  this_00 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&descBufferInfo,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1)
  ;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&bufferSampleMaskInfo,this_00,vk,device,1,1);
  VVar8 = bufferSampleMaskInfo.size;
  uVar7 = bufferSampleMaskInfo._16_8_;
  pvVar6 = bufferSampleMaskInfo.pNext;
  uVar5 = bufferSampleMaskInfo._0_8_;
  local_c8.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bufferSampleMaskInfo._16_8_;
  local_c8.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)bufferSampleMaskInfo.size;
  local_c8.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)bufferSampleMaskInfo._0_8_;
  local_c8.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)bufferSampleMaskInfo.pNext;
  bufferSampleMaskInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferSampleMaskInfo._4_4_ = 0;
  bufferSampleMaskInfo.pNext = (void *)0x0;
  bufferSampleMaskInfo.flags = 0;
  bufferSampleMaskInfo._20_4_ = 0;
  bufferSampleMaskInfo.size = 0;
  obj.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (obj.m_internal == 0) {
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = (VkDevice)uVar7;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)VVar8;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
         = uVar5;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pvVar6;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj);
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = (VkDevice)
           local_c8.m_writeDescriptorInfos.
           super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)
                  local_c8.m_writes.
                  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
         = (deUint64)
           local_c8.m_writeDescriptorInfos.
           super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface =
         (DeviceInterface *)
         local_c8.m_writeDescriptorInfos.
         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (bufferSampleMaskInfo._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&bufferSampleMaskInfo.pNext,
                 (VkDescriptorPool)bufferSampleMaskInfo._0_8_);
    }
  }
  bufferSampleMaskInfo.flags = 0;
  bufferSampleMaskInfo._20_4_ = 0;
  bufferSampleMaskInfo.size = 0;
  bufferSampleMaskInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferSampleMaskInfo._4_4_ = 0;
  bufferSampleMaskInfo.pNext = (void *)0x0;
  if (descBufferInfo.buffer.m_internal != 0) {
    operator_delete((void *)descBufferInfo.buffer.m_internal,
                    descBufferInfo.range - descBufferInfo.buffer.m_internal);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&bufferSampleMaskInfo,vk,device,
                    (VkDescriptorPool)
                    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                    object.m_internal,(VkDescriptorSetLayout)descSetLayout->m_internal);
  VVar8 = bufferSampleMaskInfo.size;
  uVar7 = bufferSampleMaskInfo._16_8_;
  pvVar6 = bufferSampleMaskInfo.pNext;
  uVar5 = bufferSampleMaskInfo._0_8_;
  local_c8.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bufferSampleMaskInfo._16_8_;
  local_c8.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)bufferSampleMaskInfo.size;
  local_c8.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)bufferSampleMaskInfo._0_8_;
  local_c8.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)bufferSampleMaskInfo.pNext;
  bufferSampleMaskInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferSampleMaskInfo._4_4_ = 0;
  bufferSampleMaskInfo.pNext = (void *)0x0;
  bufferSampleMaskInfo.flags = 0;
  bufferSampleMaskInfo._20_4_ = 0;
  bufferSampleMaskInfo.size = 0;
  pMVar1 = &this->m_descriptorSet;
  dVar2 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
          m_internal;
  if (dVar2 == 0) {
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
         (VkDevice)uVar7;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
    m_internal = VVar8;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal = uVar5;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pvVar6;
  }
  else {
    pDVar3 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface;
    descBufferInfo.buffer.m_internal = dVar2;
    (*pDVar3->_vptr_DeviceInterface[0x3d])
              (pDVar3,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                      deleter.m_device,
               (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_pool.m_internal,1);
    *(VkBufferCreateFlags *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device
         = (VkBufferCreateFlags)
           local_c8.m_writeDescriptorInfos.
           super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_device + 4) =
         local_c8.m_writeDescriptorInfos.
         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    *(undefined4 *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
      m_internal = local_c8.m_writes.
                   super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_pool.m_internal + 4) =
         local_c8.m_writes.
         super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
         _M_impl.super__Vector_impl_data._M_start._4_4_;
    *(VkStructureType *)
     &(pMVar1->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
         (VkStructureType)
         local_c8.m_writeDescriptorInfos.
         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
             m_internal + 4) =
         local_c8.m_writeDescriptorInfos.
         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
         ._M_impl.super__Vector_impl_data._M_start._4_4_;
    *(undefined4 *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
      m_deviceIface =
         local_c8.m_writeDescriptorInfos.
         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface + 4) =
         local_c8.m_writeDescriptorInfos.
         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    if (bufferSampleMaskInfo._0_8_ != 0) {
      local_c8.m_writeDescriptorInfos.
      super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)bufferSampleMaskInfo._0_8_;
      (**(code **)(*bufferSampleMaskInfo.pNext + 0x1e8))
                (bufferSampleMaskInfo.pNext,bufferSampleMaskInfo._16_8_,bufferSampleMaskInfo.size,1)
      ;
    }
  }
  makeBufferCreateInfo(&bufferSampleMaskInfo,4,0x10);
  this_01 = (Buffer *)operator_new(0x30);
  pipeline::Buffer::Buffer(this_01,vk,device,allocator,&bufferSampleMaskInfo,(MemoryRequirement)0x1)
  ;
  local_c8.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if ((this->m_buffer).
      super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>.m_data.ptr
      != this_01) {
    de::details::UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>::
    reset(&(this->m_buffer).
           super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>);
    (this->m_buffer).
    super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>.m_data.ptr =
         this_01;
  }
  de::details::UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>::reset
            ((UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_> *)
             &local_c8);
  *(undefined4 *)
   ((((this->m_buffer).
      super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>.m_data.ptr
     )->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
   ptr)->m_hostPtr =
       *(undefined4 *)
        &(this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase.
         field_0x2c;
  pAVar4 = (((this->m_buffer).
             super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>.
             m_data.ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar4->m_memory).m_internal,pAVar4->m_offset,
             0xffffffffffffffff);
  descBufferInfo.buffer.m_internal =
       (((this->m_buffer).
         super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>.m_data.
        ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  descBufferInfo.offset = 0;
  descBufferInfo.range = 4;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_c8);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      (&local_c8,
                       (int)(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                            m_data.object.m_internal,(void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  if (local_c8.m_copies.
      super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.m_copies.
                    super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.m_copies.
                          super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.m_copies.
                          super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.m_writes.
      super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.m_writes.
                    super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.m_writes.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.m_writes.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector(&local_c8.m_writeDescriptorInfos);
  return (VkDescriptorSet *)pMVar1;
}

Assistant:

const VkDescriptorSet* MSInstanceSampleMaskPattern::createMSPassDescSet (const ImageMSParams& imageMSParams, const VkDescriptorSetLayout* descSetLayout)
{
	DE_UNREF(imageMSParams);

	const DeviceInterface&		deviceInterface = m_context.getDeviceInterface();
	const VkDevice				device			= m_context.getDevice();
	Allocator&					allocator		= m_context.getDefaultAllocator();

	// Create descriptor pool
	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, 1u)
		.build(deviceInterface, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

	// Create descriptor set
	m_descriptorSet = makeDescriptorSet(deviceInterface, device, *m_descriptorPool, *descSetLayout);

	const VkBufferCreateInfo bufferSampleMaskInfo = makeBufferCreateInfo(sizeof(VkSampleMask), VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);

	m_buffer = de::MovePtr<Buffer>(new Buffer(deviceInterface, device, allocator, bufferSampleMaskInfo, MemoryRequirement::HostVisible));

	deMemcpy(m_buffer->getAllocation().getHostPtr(), &m_sampleMask, sizeof(VkSampleMask));

	flushMappedMemoryRange(deviceInterface, device, m_buffer->getAllocation().getMemory(), m_buffer->getAllocation().getOffset(), VK_WHOLE_SIZE);

	const VkDescriptorBufferInfo descBufferInfo = makeDescriptorBufferInfo(**m_buffer, 0u, sizeof(VkSampleMask));

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descBufferInfo)
		.update(deviceInterface, device);

	return &m_descriptorSet.get();
}